

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O1

void __thiscall
btSimulationIslandManager::buildAndProcessIslands
          (btSimulationIslandManager *this,btDispatcher *dispatcher,btCollisionWorld *collisionWorld
          ,IslandCallback *callback)

{
  btElement *pbVar1;
  btCollisionObject *pbVar2;
  btCollisionObject **ptr;
  btPersistentManifold **ppbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  btCollisionObject **ppbVar8;
  long lVar9;
  undefined4 extraout_var;
  uint uVar10;
  long lVar11;
  btPersistentManifold **ppbVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  btCollisionWorld *pbVar20;
  long lVar21;
  btPersistentManifoldSortPredicate local_61;
  ulong local_60;
  uint local_58;
  int local_54;
  ulong local_50;
  btCollisionWorld *local_48;
  IslandCallback *local_40;
  long local_38;
  
  local_48 = collisionWorld;
  local_40 = callback;
  buildIslands(this,dispatcher,collisionWorld);
  local_60 = (ulong)(uint)(this->m_unionFind).m_elements.m_size;
  CProfileManager::Start_Profile("processIslands");
  if (this->m_splitIslands == false) {
    iVar6 = (*dispatcher->_vptr_btDispatcher[0xb])(dispatcher);
    uVar7 = (*dispatcher->_vptr_btDispatcher[9])(dispatcher);
    (*local_40->_vptr_IslandCallback[2])
              (local_40,(local_48->m_collisionObjects).m_data,
               (ulong)(uint)(local_48->m_collisionObjects).m_size,CONCAT44(extraout_var,iVar6),
               (ulong)uVar7,0xffffffff);
  }
  else {
    iVar6 = (this->m_islandmanifold).m_size;
    if (1 < (long)iVar6) {
      btAlignedObjectArray<btPersistentManifold_*>::
      quickSortInternal<btPersistentManifoldSortPredicate>
                (&this->m_islandmanifold,&local_61,0,iVar6 + -1);
    }
    if (0 < (int)local_60) {
      iVar14 = 0;
      local_58 = 1;
      local_50 = 0;
      uVar18 = local_60;
      pbVar20 = local_48;
      local_38 = (long)iVar6;
      do {
        lVar21 = (long)iVar14;
        uVar7 = (this->m_unionFind).m_elements.m_data[lVar21].m_id;
        local_54 = iVar14 + 1;
        if (iVar14 + 1 < (int)uVar18) {
          local_54 = (int)uVar18;
        }
        bVar4 = true;
        do {
          pbVar1 = (this->m_unionFind).m_elements.m_data;
          if (pbVar1[lVar21].m_id != uVar7) {
            local_54 = (int)lVar21;
            break;
          }
          pbVar2 = (pbVar20->m_collisionObjects).m_data[pbVar1[lVar21].m_sz];
          iVar6 = (this->m_islandBodies).m_size;
          iVar14 = (this->m_islandBodies).m_capacity;
          if (iVar6 == iVar14) {
            iVar15 = iVar6 * 2;
            if (iVar6 == 0) {
              iVar15 = 1;
            }
            if (iVar14 < iVar15) {
              if (iVar15 == 0) {
                ppbVar8 = (btCollisionObject **)0x0;
              }
              else {
                ppbVar8 = (btCollisionObject **)btAlignedAllocInternal((long)iVar15 << 3,0x10);
              }
              lVar9 = (long)(this->m_islandBodies).m_size;
              if (0 < lVar9) {
                lVar11 = 0;
                do {
                  ppbVar8[lVar11] = (this->m_islandBodies).m_data[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar9 != lVar11);
              }
              ptr = (this->m_islandBodies).m_data;
              if (ptr != (btCollisionObject **)0x0) {
                if ((this->m_islandBodies).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr);
                }
                (this->m_islandBodies).m_data = (btCollisionObject **)0x0;
              }
              (this->m_islandBodies).m_ownsMemory = true;
              (this->m_islandBodies).m_data = ppbVar8;
              (this->m_islandBodies).m_capacity = iVar15;
              uVar18 = local_60;
              pbVar20 = local_48;
            }
          }
          iVar6 = (this->m_islandBodies).m_size;
          (this->m_islandBodies).m_data[iVar6] = pbVar2;
          (this->m_islandBodies).m_size = iVar6 + 1;
          iVar6 = pbVar2->m_activationState1;
          bVar5 = bVar4;
          if (iVar6 != 5) {
            bVar5 = false;
          }
          if (iVar6 == 2) {
            bVar5 = bVar4;
          }
          bVar4 = bVar5;
          lVar21 = lVar21 + 1;
        } while (lVar21 < (long)uVar18);
        uVar19 = (uint)local_50;
        uVar13 = (uint)local_38;
        if ((int)uVar19 < (int)uVar13) {
          ppbVar3 = (this->m_islandmanifold).m_data;
          lVar21 = (long)(int)uVar19;
          uVar10 = ppbVar3[lVar21]->m_body0->m_islandTag1;
          if ((int)uVar10 < 0) {
            uVar10 = ppbVar3[lVar21]->m_body1->m_islandTag1;
          }
          if (uVar10 != uVar7) goto LAB_0015b8bf;
          ppbVar12 = ppbVar3 + lVar21;
          uVar10 = uVar19;
          uVar16 = uVar19 + 1;
          if ((int)(uVar19 + 1) < (int)uVar13) {
            uVar16 = uVar13;
          }
          do {
            lVar21 = lVar21 + 1;
            uVar13 = uVar16;
            if (local_38 <= lVar21) break;
            uVar17 = ppbVar3[lVar21]->m_body0->m_islandTag1;
            if ((int)uVar17 < 0) {
              uVar17 = ppbVar3[lVar21]->m_body1->m_islandTag1;
            }
            uVar13 = uVar10 + 1;
            uVar18 = local_60;
            uVar10 = uVar13;
          } while (uVar7 == uVar17);
          uVar19 = uVar13 - uVar19;
        }
        else {
LAB_0015b8bf:
          uVar19 = 0;
          ppbVar12 = (btPersistentManifold **)0x0;
          uVar13 = local_58;
        }
        if (!bVar4) {
          (*local_40->_vptr_IslandCallback[2])
                    (local_40,(this->m_islandBodies).m_data,
                     (ulong)(uint)(this->m_islandBodies).m_size,ppbVar12,(ulong)uVar19,(ulong)uVar7)
          ;
          uVar18 = local_60;
        }
        pbVar20 = local_48;
        iVar14 = local_54;
        local_50 = local_50 & 0xffffffff;
        if (uVar19 != 0) {
          local_50 = (ulong)uVar13;
        }
        iVar6 = (this->m_islandBodies).m_size;
        lVar21 = (long)iVar6;
        local_58 = uVar13;
        if ((lVar21 < 1) && (iVar6 < 0)) {
          if ((this->m_islandBodies).m_capacity < 0) {
            ppbVar8 = (this->m_islandBodies).m_data;
            if (ppbVar8 != (btCollisionObject **)0x0) {
              if ((this->m_islandBodies).m_ownsMemory == true) {
                btAlignedFreeInternal(ppbVar8);
              }
              (this->m_islandBodies).m_data = (btCollisionObject **)0x0;
            }
            (this->m_islandBodies).m_ownsMemory = true;
            (this->m_islandBodies).m_data = (btCollisionObject **)0x0;
            (this->m_islandBodies).m_capacity = 0;
            uVar18 = local_60;
          }
          if (iVar6 < 0) {
            do {
              (this->m_islandBodies).m_data[lVar21] = (btCollisionObject *)0x0;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0);
          }
        }
        (this->m_islandBodies).m_size = 0;
      } while (iVar14 < (int)uVar18);
    }
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void btSimulationIslandManager::buildAndProcessIslands(btDispatcher* dispatcher,btCollisionWorld* collisionWorld, IslandCallback* callback)
{
	btCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	buildIslands(dispatcher,collisionWorld);

	int endIslandIndex=1;
	int startIslandIndex;
	int numElem = getUnionFind().getNumElements();

	BT_PROFILE("processIslands");

	if(!m_splitIslands)
	{
		btPersistentManifold** manifold = dispatcher->getInternalManifoldPointer();
		int maxNumManifolds = dispatcher->getNumManifolds();
		callback->processIsland(&collisionObjects[0],collisionObjects.size(),manifold,maxNumManifolds, -1);
	}
	else
	{
		// Sort manifolds, based on islands
		// Sort the vector using predicate and std::sort
		//std::sort(islandmanifold.begin(), islandmanifold.end(), btPersistentManifoldSortPredicate);

		int numManifolds = int (m_islandmanifold.size());

		//tried a radix sort, but quicksort/heapsort seems still faster
		//@todo rewrite island management
		m_islandmanifold.quickSort(btPersistentManifoldSortPredicate());
		//m_islandmanifold.heapSort(btPersistentManifoldSortPredicate());

		//now process all active islands (sets of manifolds for now)

		int startManifoldIndex = 0;
		int endManifoldIndex = 1;

		//int islandId;

		

	//	printf("Start Islands\n");

		//traverse the simulation islands, and call the solver, unless all objects are sleeping/deactivated
		for ( startIslandIndex=0;startIslandIndex<numElem;startIslandIndex = endIslandIndex)
		{
			int islandId = getUnionFind().getElement(startIslandIndex).m_id;


			   bool islandSleeping = true;
	                
					for (endIslandIndex = startIslandIndex;(endIslandIndex<numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId);endIslandIndex++)
					{
							int i = getUnionFind().getElement(endIslandIndex).m_sz;
							btCollisionObject* colObj0 = collisionObjects[i];
							m_islandBodies.push_back(colObj0);
							if (colObj0->isActive())
									islandSleeping = false;
					}
	                

			//find the accompanying contact manifold for this islandId
			int numIslandManifolds = 0;
			btPersistentManifold** startManifold = 0;

			if (startManifoldIndex<numManifolds)
			{
				int curIslandId = getIslandId(m_islandmanifold[startManifoldIndex]);
				if (curIslandId == islandId)
				{
					startManifold = &m_islandmanifold[startManifoldIndex];
				
					for (endManifoldIndex = startManifoldIndex+1;(endManifoldIndex<numManifolds) && (islandId == getIslandId(m_islandmanifold[endManifoldIndex]));endManifoldIndex++)
					{

					}
					/// Process the actual simulation, only if not sleeping/deactivated
					numIslandManifolds = endManifoldIndex-startManifoldIndex;
				}

			}

			if (!islandSleeping)
			{
				callback->processIsland(&m_islandBodies[0],m_islandBodies.size(),startManifold,numIslandManifolds, islandId);
	//			printf("Island callback of size:%d bodies, %d manifolds\n",islandBodies.size(),numIslandManifolds);
			}
			
			if (numIslandManifolds)
			{
				startManifoldIndex = endManifoldIndex;
			}

			m_islandBodies.resize(0);
		}
	} // else if(!splitIslands) 

}